

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O1

bool __thiscall ConfigReader::parsePad(ConfigReader *this)

{
  token_t tVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  long *plVar5;
  byte bVar6;
  bool bVar7;
  string cellname;
  string instance;
  string location;
  string tokstr;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> items;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  tVar1 = tokenize(this,&local_110);
  if (tVar1 == TOK_IDENT) {
    tVar1 = tokenize(this,&local_f0);
    if (tVar1 == TOK_IDENT) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"N","");
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"E","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"S","");
      plVar5 = local_40;
      local_50[0] = plVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"W","");
      pbVar3 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (&local_b0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xffffffffffffffd0,&local_f0);
      if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xffffffffffffffd0) {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"Expected a pad location to be one of N/E/S/W\n","");
        error(this,&local_150);
LAB_0012a13d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        bVar7 = false;
      }
      else {
        tVar1 = tokenize(this,&local_130);
        if (tVar1 == TOK_IDENT) {
          iVar2 = std::__cxx11::string::compare((char *)&local_130);
          if (iVar2 == 0) {
            tVar1 = tokenize(this,&local_130);
            bVar7 = tVar1 == TOK_IDENT;
            bVar6 = 1;
          }
          else {
            bVar7 = true;
            bVar6 = 0;
          }
        }
        else {
          bVar6 = 0;
          bVar7 = false;
        }
        if (!bVar7) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"Expected a cell name\n","");
          error(this,&local_150);
          goto LAB_0012a13d;
        }
        tVar1 = tokenize(this,&local_d0);
        if (tVar1 != TOK_SEMICOL) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Expected ;\n","");
          error(this,&local_150);
          goto LAB_0012a13d;
        }
        this->m_padCount = this->m_padCount + 1;
        bVar7 = true;
        (*this->_vptr_ConfigReader[3])(this,&local_110,&local_f0,&local_130,(ulong)bVar6);
      }
      lVar4 = -0x80;
      do {
        if (plVar5 != (long *)plVar5[-2]) {
          operator_delete((long *)plVar5[-2],*plVar5 + 1);
        }
        plVar5 = plVar5 + -4;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      goto LAB_0012a184;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expected a location\n","");
    error(this,&local_b0);
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Expected an instance name\n","");
    error(this,&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar7 = false;
LAB_0012a184:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool ConfigReader::parsePad()
{
    // PAD: instance location cellname
    std::string tokstr;
    std::string instance;
    std::string location;
    std::string cellname;
    bool flipped = false;

    // instance name
    ConfigReader::token_t tok = tokenize(instance);
    if (tok != TOK_IDENT)
    {
        error("Expected an instance name\n");
        return false;
    }

    // location name
    tok = tokenize(location);
    if (tok != TOK_IDENT)
    {
        error("Expected a location\n");
        return false;
    }

    // PADs can only be on North, South, East or West
    std::array<std::string, 4> items = {"N","E","S","W"};
    if (!inArray(location, items))
    {
        error("Expected a pad location to be one of N/E/S/W\n");
        return false;
    }

    // parse optional 'FLIP' argument for flipped cells
    tok = tokenize(cellname);
    if ((tok == TOK_IDENT) && (cellname == "FLIP"))
    {
        flipped = true;
        tok = tokenize(cellname);
    }

    // cell name    
    if (tok != TOK_IDENT)
    {
        error("Expected a cell name\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    m_padCount++;
    onPad(instance,location,cellname,flipped);

    return true;
}